

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O1

int __thiscall ncnn::Padding::forward(Padding *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float v;
  uint _c;
  int *piVar1;
  size_t _elemsize;
  size_t sVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  Mat borderm;
  Mat m;
  Mat local_b8;
  Mat local_78;
  float *local_38;
  
  if (((this->top == 0 && this->bottom == 0) && this->left == 0) && this->right == 0) {
    iVar5 = 0;
    if (top_blob != bottom_blob) {
      piVar1 = bottom_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = top_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar1 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar1;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar5 = bottom_blob->w;
      iVar6 = bottom_blob->h;
      iVar4 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar5;
      top_blob->h = iVar6;
      top_blob->c = iVar4;
      top_blob->cstep = bottom_blob->cstep;
      iVar5 = 0;
    }
  }
  else {
    iVar5 = bottom_blob->dims;
    _elemsize = bottom_blob->elemsize;
    iVar6 = this->right + this->left + bottom_blob->w;
    if (iVar5 == 1) {
      Mat::create(top_blob,iVar6,_elemsize,opt->blob_allocator);
      iVar5 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (_elemsize == 4) {
          iVar5 = 0;
          copy_make_border_image<float>(bottom_blob,top_blob,0,this->left,this->type,this->value);
        }
        else if (_elemsize == 2) {
          iVar5 = 0;
          copy_make_border_image<unsigned_short>
                    (bottom_blob,top_blob,0,this->left,this->type,
                     *(unsigned_short *)((long)&this->value + 2));
        }
        else {
          iVar5 = 0;
          if (_elemsize == 1) {
            iVar5 = 0;
            copy_make_border_image<signed_char>
                      (bottom_blob,top_blob,0,this->left,this->type,(char)(int)this->value);
          }
        }
      }
    }
    else {
      iVar4 = this->bottom + this->top + bottom_blob->h;
      if (iVar5 == 3) {
        _c = bottom_blob->c;
        Mat::create(top_blob,iVar6,iVar4,_c,_elemsize,opt->blob_allocator);
        iVar5 = -100;
        if (((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) &&
           (iVar5 = 0, 0 < (int)_c)) {
          local_38 = &this->value;
          uVar7 = 0;
          iVar5 = 0;
          do {
            sVar2 = bottom_blob->elemsize;
            local_78.data = (void *)(bottom_blob->cstep * uVar7 * sVar2 + (long)bottom_blob->data);
            local_78.elempack = bottom_blob->elempack;
            local_78.allocator = bottom_blob->allocator;
            local_78.refcount._0_4_ = 0;
            local_78.refcount._4_4_ = 0;
            local_78.elemsize._0_4_ = (undefined4)sVar2;
            local_78.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
            local_78.w = bottom_blob->w;
            local_78.dims = 2;
            local_78.c = 1;
            local_78.h = bottom_blob->h;
            local_78.cstep = (size_t)(bottom_blob->h * bottom_blob->w);
            sVar2 = top_blob->elemsize;
            local_b8.data = (void *)(top_blob->cstep * uVar7 * sVar2 + (long)top_blob->data);
            local_b8.elempack = top_blob->elempack;
            local_b8.allocator = top_blob->allocator;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.elemsize._0_4_ = (undefined4)sVar2;
            local_b8.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
            local_b8.w = top_blob->w;
            local_b8.dims = 2;
            local_b8.c = 1;
            local_b8.h = top_blob->h;
            local_b8.cstep = (size_t)(top_blob->h * top_blob->w);
            pfVar3 = (float *)(uVar7 * 4 + (long)(this->per_channel_pad_data).data);
            if (this->per_channel_pad_data_size == 0) {
              pfVar3 = local_38;
            }
            v = *pfVar3;
            if (_elemsize == 4) {
              copy_make_border_image<float>(&local_78,&local_b8,this->top,this->left,this->type,v);
            }
            else if (_elemsize == 2) {
              copy_make_border_image<unsigned_short>
                        (&local_78,&local_b8,this->top,this->left,this->type,
                         (unsigned_short)((uint)v >> 0x10));
            }
            else if (_elemsize == 1) {
              copy_make_border_image<signed_char>
                        (&local_78,&local_b8,this->top,this->left,this->type,(char)(int)v);
            }
            piVar1 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (local_b8.allocator == (Allocator *)0x0) {
                  if (local_b8.data != (void *)0x0) {
                    free(local_b8.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                }
              }
            }
            local_b8.elemsize._0_4_ = 0;
            local_b8.elemsize._4_4_ = 0;
            local_b8.elempack = 0;
            local_b8.data = (void *)0x0;
            local_b8.refcount._0_4_ = 0;
            local_b8.refcount._4_4_ = 0;
            local_b8.dims = 0;
            local_b8.w = 0;
            local_b8.h = 0;
            local_b8.c = 0;
            local_b8.cstep = 0;
            piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (local_78.allocator == (Allocator *)0x0) {
                  if (local_78.data != (void *)0x0) {
                    free(local_78.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_78.allocator + 0x18))();
                }
              }
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != _c);
        }
      }
      else {
        if (iVar5 == 2) {
          Mat::create(top_blob,iVar6,iVar4,_elemsize,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          if (_elemsize == 4) {
            copy_make_border_image<float>
                      (bottom_blob,top_blob,this->top,this->left,this->type,this->value);
          }
          else if (_elemsize == 2) {
            copy_make_border_image<unsigned_short>
                      (bottom_blob,top_blob,this->top,this->left,this->type,
                       *(unsigned_short *)((long)&this->value + 2));
          }
          else if (_elemsize == 1) {
            copy_make_border_image<signed_char>
                      (bottom_blob,top_blob,this->top,this->left,this->type,(char)(int)this->value);
          }
        }
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int Padding::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w + left + right;

    if (dims == 1)
    {
        top_blob.create(outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, 0, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, 0, left, type, float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, 0, left, type, value);

        return 0;
    }

    int outh = h + top + bottom;

    if (dims == 2)
    {
        top_blob.create(outw, outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, top, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, top, left, type, float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, top, left, type, value);

        return 0;
    }

    if (dims == 3)
    {
        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob.channel(q);
            Mat borderm = top_blob.channel(q);

            float pad_value = per_channel_pad_data_size ? per_channel_pad_data[q] : value;

            if (elemsize == 1)
                copy_make_border_image<signed char>(m, borderm, top, left, type, static_cast<signed char>(pad_value));
            if (elemsize == 2)
                copy_make_border_image<unsigned short>(m, borderm, top, left, type, float32_to_bfloat16(pad_value));
            if (elemsize == 4)
                copy_make_border_image<float>(m, borderm, top, left, type, pad_value);
        }

        return 0;
    }

    return 0;
}